

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::PrintEnum
          (Generator *this,EnumDescriptor *enum_descriptor,EnumDescriptorProto *proto)

{
  Printer *pPVar1;
  int iVar2;
  uint uVar3;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char>,_std::__cxx11::basic_string<char>_>_>
  pbVar4;
  EnumOptions *this_00;
  EnumValueDescriptor *descriptor;
  EnumValueDescriptorProto *proto_00;
  char *pcVar5;
  undefined1 auVar6 [16];
  string_view serialized_options;
  string_view local_2e8;
  string_view local_2d8;
  string_view local_2c8;
  undefined1 local_2b8 [8];
  EnumDescriptorProto edp;
  string local_230;
  string_view local_210;
  string_view local_200;
  string_view local_1f0;
  string_view local_1e0;
  int local_1cc;
  undefined1 auStack_1c8 [4];
  int i;
  undefined1 local_1b8 [8];
  string options_string;
  char enum_descriptor_template [183];
  allocator<char> local_d9;
  string_view local_d8;
  string local_c8 [39];
  allocator<char> local_a1;
  string_view local_a0;
  string local_90 [48];
  undefined1 local_60 [8];
  string module_level_descriptor_name;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m;
  EnumDescriptorProto *proto_local;
  EnumDescriptor *enum_descriptor_local;
  Generator *this_local;
  
  absl::lts_20250127::
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::flat_hash_map((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)((long)&module_level_descriptor_name.field_2 + 8));
  ModuleLevelDescriptorName<google::protobuf::EnumDescriptor>
            ((string *)local_60,this,enum_descriptor);
  pbVar4 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[16],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)(module_level_descriptor_name.field_2._M_local_buf + 8),
                      (key_arg<char[16]> *)0x1fbbe0a);
  std::__cxx11::string::operator=((string *)pbVar4,(string *)local_60);
  local_a0 = EnumDescriptor::name(enum_descriptor);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_90,&local_a0,&local_a1);
  pbVar4 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[5],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)(module_level_descriptor_name.field_2._M_local_buf + 8),
                      (key_arg<char[5]> *)0x1d1c66d);
  std::__cxx11::string::operator=((string *)pbVar4,local_90);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_a1);
  local_d8 = EnumDescriptor::full_name(enum_descriptor);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_c8,&local_d8,&local_d9);
  pbVar4 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[10],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)(module_level_descriptor_name.field_2._M_local_buf + 8),
                      (key_arg<char[10]> *)0x208afb9);
  std::__cxx11::string::operator=((string *)pbVar4,local_c8);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator(&local_d9);
  pbVar4 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[5],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)(module_level_descriptor_name.field_2._M_local_buf + 8),
                      (key_arg<char[5]> *)0x1eed29c);
  std::__cxx11::string::operator=((string *)pbVar4,"DESCRIPTOR");
  memcpy((void *)((long)&options_string.field_2 + 8),
         "$descriptor_name$ = _descriptor.EnumDescriptor(\n  name=\'$name$\',\n  full_name=\'$full_name$\',\n  filename=None,\n  file=$file$,\n  create_key=_descriptor._internal_create_key,\n  values=[\n"
         ,0xb7);
  std::__cxx11::string::string((string *)local_1b8);
  this_00 = EnumDescriptorProto::options(proto);
  protobuf::MessageLite::SerializeToString((MessageLite *)this_00,(string *)local_1b8);
  pPVar1 = this->printer_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_1c8,
             options_string.field_2._M_local_buf + 8);
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar1,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)((long)&module_level_descriptor_name.field_2 + 8),_auStack_1c8);
  protobuf::io::Printer::Indent(this->printer_);
  protobuf::io::Printer::Indent(this->printer_);
  local_1cc = 0;
  while( true ) {
    iVar2 = local_1cc;
    uVar3 = EnumDescriptor::value_count(enum_descriptor);
    pcVar5 = (char *)(ulong)uVar3;
    if ((int)uVar3 <= iVar2) break;
    descriptor = EnumDescriptor::value(enum_descriptor,local_1cc);
    proto_00 = EnumDescriptorProto::value(proto,local_1cc);
    PrintEnumValueDescriptor(this,descriptor,proto_00);
    pPVar1 = this->printer_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1e0,",\n");
    protobuf::io::Printer::Print<>(pPVar1,local_1e0);
    local_1cc = local_1cc + 1;
  }
  protobuf::io::Printer::Outdent(this->printer_);
  pPVar1 = this->printer_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1f0,"],\n");
  protobuf::io::Printer::Print<>(pPVar1,local_1f0);
  pPVar1 = this->printer_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_200,"containing_type=None,\n");
  protobuf::io::Printer::Print<>(pPVar1,local_200);
  pPVar1 = this->printer_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_210,"serialized_options=$options_value$,\n");
  auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_1b8);
  serialized_options._M_len = auVar6._8_8_;
  edp.field_0._96_8_ = auVar6._0_8_;
  serialized_options._M_str = pcVar5;
  python::(anonymous_namespace)::OptionsValue_abi_cxx11_
            (&local_230,(_anonymous_namespace_ *)edp.field_0._96_8_,serialized_options);
  protobuf::io::Printer::Print<char[14],std::__cxx11::string>
            (pPVar1,local_210,(char (*) [14])"options_value",&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  EnumDescriptorProto::EnumDescriptorProto((EnumDescriptorProto *)local_2b8);
  protobuf::io::Printer::Outdent(this->printer_);
  pPVar1 = this->printer_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2c8,")\n");
  protobuf::io::Printer::Print<>(pPVar1,local_2c8);
  pPVar1 = this->printer_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_2d8,"_sym_db.RegisterEnumDescriptor($name$)\n");
  protobuf::io::Printer::Print<char[5],std::__cxx11::string>
            (pPVar1,local_2d8,(char (*) [5])0x1d1c66d,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  pPVar1 = this->printer_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2e8,"\n");
  protobuf::io::Printer::Print<>(pPVar1,local_2e8);
  EnumDescriptorProto::~EnumDescriptorProto((EnumDescriptorProto *)local_2b8);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::~string((string *)local_60);
  absl::lts_20250127::
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~flat_hash_map((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)((long)&module_level_descriptor_name.field_2 + 8));
  return;
}

Assistant:

void Generator::PrintEnum(const EnumDescriptor& enum_descriptor,
                          const EnumDescriptorProto& proto) const {
  absl::flat_hash_map<absl::string_view, std::string> m;
  std::string module_level_descriptor_name =
      ModuleLevelDescriptorName(enum_descriptor);
  m["descriptor_name"] = module_level_descriptor_name;
  m["name"] = std::string(enum_descriptor.name());
  m["full_name"] = std::string(enum_descriptor.full_name());
  m["file"] = kDescriptorKey;
  const char enum_descriptor_template[] =
      "$descriptor_name$ = _descriptor.EnumDescriptor(\n"
      "  name='$name$',\n"
      "  full_name='$full_name$',\n"
      "  filename=None,\n"
      "  file=$file$,\n"
      "  create_key=_descriptor._internal_create_key,\n"
      "  values=[\n";
  std::string options_string;
  proto.options().SerializeToString(&options_string);
  printer_->Print(m, enum_descriptor_template);
  printer_->Indent();
  printer_->Indent();

  for (int i = 0; i < enum_descriptor.value_count(); ++i) {
    PrintEnumValueDescriptor(*enum_descriptor.value(i), proto.value(i));
    printer_->Print(",\n");
  }

  printer_->Outdent();
  printer_->Print("],\n");
  printer_->Print("containing_type=None,\n");
  printer_->Print("serialized_options=$options_value$,\n", "options_value",
                  OptionsValue(options_string));
  EnumDescriptorProto edp;
  printer_->Outdent();
  printer_->Print(")\n");
  printer_->Print("_sym_db.RegisterEnumDescriptor($name$)\n", "name",
                  module_level_descriptor_name);
  printer_->Print("\n");
}